

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_map.cpp
# Opt level: O0

void AM_drawLineCharacter
               (mline_t *lineguy,int lineguylines,double scale,DAngle *angle,AMColor *color,double x
               ,double y)

{
  bool bVar1;
  TAngle<double> local_78;
  TAngle<double> local_70;
  undefined1 local_68 [8];
  mline_t l;
  int i;
  double y_local;
  double x_local;
  AMColor *color_local;
  DAngle *angle_local;
  double scale_local;
  int lineguylines_local;
  mline_t *lineguy_local;
  
  for (l.b.y._4_4_ = 0; l.b.y._4_4_ < lineguylines; l.b.y._4_4_ = l.b.y._4_4_ + 1) {
    local_68 = (undefined1  [8])lineguy[l.b.y._4_4_].a.x;
    l.a.x = lineguy[l.b.y._4_4_].a.y;
    if ((scale != 0.0) || (NAN(scale))) {
      local_68 = (undefined1  [8])(scale * (double)local_68);
      l.a.x = scale * l.a.x;
    }
    bVar1 = TAngle<double>::operator!=(angle,0.0);
    if (bVar1) {
      TAngle<double>::TAngle(&local_70,angle);
      AM_rotate((double *)local_68,(double *)&l,&local_70);
    }
    local_68 = (undefined1  [8])(x + (double)local_68);
    l.a.x = y + l.a.x;
    l.a.y = lineguy[l.b.y._4_4_].b.x;
    l.b.x = lineguy[l.b.y._4_4_].b.y;
    if ((scale != 0.0) || (NAN(scale))) {
      l.a.y = scale * l.a.y;
      l.b.x = scale * l.b.x;
    }
    bVar1 = TAngle<double>::operator!=(angle,0.0);
    if (bVar1) {
      TAngle<double>::TAngle(&local_78,angle);
      AM_rotate(&l.a.y,&l.b.x,&local_78);
    }
    l.a.y = x + l.a.y;
    l.b.x = y + l.b.x;
    AM_drawMline((mline_t *)local_68,color);
  }
  return;
}

Assistant:

void
AM_drawLineCharacter
( const mline_t *lineguy,
  int		lineguylines,
  double	scale,
  DAngle	angle,
  const AMColor &color,
  double	x,
  double	y )
{
	int		i;
	mline_t	l;

	for (i=0;i<lineguylines;i++) {
		l.a.x = lineguy[i].a.x;
		l.a.y = lineguy[i].a.y;

		if (scale) {
			l.a.x *= scale;
			l.a.y *= scale;
		}

		if (angle != 0)
			AM_rotate(&l.a.x, &l.a.y, angle);

		l.a.x += x;
		l.a.y += y;

		l.b.x = lineguy[i].b.x;
		l.b.y = lineguy[i].b.y;

		if (scale) {
			l.b.x *= scale;
			l.b.y *= scale;
		}

		if (angle != 0)
			AM_rotate(&l.b.x, &l.b.y, angle);

		l.b.x += x;
		l.b.y += y;

		AM_drawMline(&l, color);
	}
}